

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluation.c
# Opt level: O0

unsigned_long_long evaluate_literal_integer_hex(token *token,Translation_Data *translation_data)

{
  ulong local_30;
  size_t i;
  ulong uStack_20;
  uchar digit;
  unsigned_long_long accumulate;
  Translation_Data *translation_data_local;
  token *token_local;
  
  uStack_20 = 0;
  for (local_30 = 2; local_30 < token->data_size; local_30 = local_30 + 1) {
    if (token->data[local_30] < ':') {
      i._7_1_ = token->data[local_30] - 0x30;
    }
    else if ((token->data[local_30] < 'g') && ('`' < token->data[local_30])) {
      i._7_1_ = token->data[local_30] + 0xa9;
    }
    else {
      i._7_1_ = token->data[local_30] - 0x37;
    }
    uStack_20 = (i._7_1_ | uStack_20) << 4;
  }
  return uStack_20;
}

Assistant:

unsigned long long int evaluate_literal_integer_hex(struct token *token,struct Translation_Data *translation_data)
{
	unsigned long long int accumulate=0;
	unsigned char digit;
	size_t i;
	/* skip the leading 0x */
	for(i=2;i<token->data_size;++i)
	{
		if(token->data[i]<='9')
			digit=token->data[i]-'0';
		else if(token->data[i]<='f' && token->data[i]>='a')
			digit=10+(token->data[i]-'a');
		else
			digit=10+(token->data[i]-'A');
		accumulate|=digit,accumulate<<=4;
	}
	return accumulate;
}